

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  Type TVar1;
  ostream *poVar2;
  int in_ECX;
  internal *this;
  char *pcVar3;
  string local_40;
  
  this = (internal *)(result->file_name_)._M_string_length;
  if (this != (internal *)0x0) {
    this = (internal *)(result->file_name_)._M_dataplus._M_p;
  }
  internal::FormatFileLocation_abi_cxx11_
            (&local_40,this,(char *)(ulong)(uint)result->line_number_,in_ECX);
  poVar2 = std::operator<<(os,(string *)&local_40);
  poVar2 = std::operator<<(poVar2," ");
  TVar1 = result->type_;
  if (TVar1 == kSuccess) {
    pcVar3 = "Success";
  }
  else if (TVar1 == kSkip) {
    pcVar3 = "Skipped";
  }
  else {
    pcVar3 = "Non-fatal failure";
    if (TVar1 == kFatalFailure) {
      pcVar3 = "Fatal failure";
    }
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,":\n");
  poVar2 = std::operator<<(poVar2,(result->message_)._M_dataplus._M_p);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os << internal::FormatFileLocation(result.file_name(),
                                            result.line_number())
            << " "
            << (result.type() == TestPartResult::kSuccess ? "Success"
                : result.type() == TestPartResult::kSkip  ? "Skipped"
                : result.type() == TestPartResult::kFatalFailure
                    ? "Fatal failure"
                    : "Non-fatal failure")
            << ":\n"
            << result.message() << std::endl;
}